

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O0

bool Disassembler::labelExists(int line)

{
  size_type sVar1;
  reference pvVar2;
  int local_14;
  int i;
  int line_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(&labels_abi_cxx11_);
    if (sVar1 <= (ulong)(long)local_14) {
      return false;
    }
    pvVar2 = std::
             vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&labels_abi_cxx11_,(long)local_14);
    if (pvVar2->first == line + 2) break;
    local_14 = local_14 + 1;
  }
  return true;
}

Assistant:

bool Disassembler::labelExists(int line){
  for(int i = 0;i < labels.size();i++)
    if(labels[i].first == line+2)// .globl e .text
      return true;
  return false;
}